

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O0

size_t __thiscall jrtplib::RTCPCompoundPacketBuilder::SDESSource::NeededBytes(SDESSource *this)

{
  size_t r;
  size_t x;
  SDESSource *this_local;
  
  r = this->totalitemsize + 1;
  if ((r & 3) != 0) {
    r = (4 - (r & 3)) + r;
  }
  return r + 4;
}

Assistant:

size_t NeededBytes()
		{
			size_t x,r;
			x = totalitemsize + 1; // +1 for the 0 byte which terminates the item list
			r = x%sizeof(uint32_t);
			if (r != 0)
				x += (sizeof(uint32_t)-r); // make sure it ends on a 32 bit boundary
			x += sizeof(uint32_t); // for ssrc
			return x;
		}